

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_omac_acpkm.c
# Opt level: O2

int omac_acpkm_imit_copy(EVP_MD_CTX *to,EVP_MD_CTX *from)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  undefined8 *puVar9;
  long *plVar10;
  CMAC_ACPKM_CTX *ctx;
  CMAC_ACPKM_CTX *pCVar11;
  
  puVar9 = (undefined8 *)EVP_MD_CTX_get0_md_data();
  plVar10 = (long *)EVP_MD_CTX_get0_md_data(from);
  iVar7 = 0;
  iVar8 = 0;
  if (puVar9 != (undefined8 *)0x0 && plVar10 != (long *)0x0) {
    puVar9[1] = plVar10[1];
    puVar9[2] = plVar10[2];
    *(int *)(puVar9 + 3) = (int)plVar10[3];
    pCVar11 = (CMAC_ACPKM_CTX *)*plVar10;
    ctx = (CMAC_ACPKM_CTX *)*puVar9;
    if (pCVar11 == (CMAC_ACPKM_CTX *)0x0) {
      iVar8 = 1;
      if (ctx != (CMAC_ACPKM_CTX *)0x0) {
        CMAC_ACPKM_CTX_free(ctx);
        *puVar9 = 0;
      }
    }
    else {
      if (ctx == pCVar11 || ctx == (CMAC_ACPKM_CTX *)0x0) {
        ctx = CMAC_ACPKM_CTX_new();
        *puVar9 = ctx;
        if (ctx == (CMAC_ACPKM_CTX *)0x0) {
          return 0;
        }
        pCVar11 = (CMAC_ACPKM_CTX *)*plVar10;
      }
      iVar8 = iVar7;
      if (((pCVar11->nlast_block != -1) &&
          (iVar7 = EVP_CIPHER_CTX_copy((EVP_CIPHER_CTX *)ctx->cctx,(EVP_CIPHER_CTX *)pCVar11->cctx),
          iVar7 != 0)) &&
         (iVar7 = EVP_CIPHER_CTX_copy((EVP_CIPHER_CTX *)ctx->actx,(EVP_CIPHER_CTX *)pCVar11->actx),
         iVar7 != 0)) {
        iVar8 = EVP_CIPHER_CTX_get_block_size(pCVar11->cctx);
        uVar1 = *(undefined8 *)(pCVar11->km + 8);
        uVar2 = *(undefined8 *)(pCVar11->km + 0x10);
        uVar3 = *(undefined8 *)(pCVar11->km + 0x18);
        uVar4 = *(undefined8 *)(pCVar11->km + 0x20);
        uVar5 = *(undefined8 *)(pCVar11->km + 0x28);
        *(undefined8 *)ctx->km = *(undefined8 *)pCVar11->km;
        *(undefined8 *)(ctx->km + 8) = uVar1;
        *(undefined8 *)(ctx->km + 0x10) = uVar2;
        *(undefined8 *)(ctx->km + 0x18) = uVar3;
        *(undefined8 *)(ctx->km + 0x20) = uVar4;
        *(undefined8 *)(ctx->km + 0x28) = uVar5;
        memcpy(ctx->tbl,pCVar11->tbl,(long)iVar8);
        memcpy(ctx->last_block,pCVar11->last_block,(long)iVar8);
        uVar6 = pCVar11->section_size;
        ctx->nlast_block = pCVar11->nlast_block;
        ctx->section_size = uVar6;
        ctx->num = pCVar11->num;
        iVar8 = 1;
      }
    }
  }
  return iVar8;
}

Assistant:

static int omac_acpkm_imit_copy(EVP_MD_CTX *to, const EVP_MD_CTX *from)
{
    OMAC_ACPKM_CTX *c_to = EVP_MD_CTX_md_data(to);
    const OMAC_ACPKM_CTX *c_from = EVP_MD_CTX_md_data(from);

    if (c_from && c_to) {
        c_to->dgst_size = c_from->dgst_size;
        c_to->cipher_name = c_from->cipher_name;
        c_to->key_set = c_from->key_set;
    } else {
        return 0;
    }
    if (!c_from->cmac_ctx) {
        if (c_to->cmac_ctx) {
            CMAC_ACPKM_CTX_free(c_to->cmac_ctx);
            c_to->cmac_ctx = NULL;
        }
        return 1;
    }
    if ((c_to->cmac_ctx == c_from->cmac_ctx) || (c_to->cmac_ctx == NULL))  {
        c_to->cmac_ctx = CMAC_ACPKM_CTX_new();
    }

    return (c_to->cmac_ctx) ? CMAC_ACPKM_CTX_copy(c_to->cmac_ctx, c_from->cmac_ctx) : 0;
}